

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  global_State *pgVar1;
  GCObject *pGVar2;
  bool bVar3;
  GCObject *o;
  UpVal *uv;
  UpVal *p;
  GCObject **pp;
  global_State *g;
  StkId level_local;
  lua_State *L_local;
  
  pgVar1 = L->l_G;
  p = (UpVal *)&L->openupval;
  while( true ) {
    bVar3 = false;
    if (p->next != (GCObject *)0x0) {
      uv = (UpVal *)p->next;
      bVar3 = level <= ((Table *)uv)->array;
    }
    if (!bVar3) break;
    if (uv->v == level) {
      if ((byte)((uv->marked ^ 3) & (pgVar1->currentwhite ^ 3)) == 0) {
        uv->marked = uv->marked ^ 3;
      }
      return uv;
    }
    p = uv;
  }
  pGVar2 = luaC_newobj(L,10,0x28,&p->next,0);
  (pGVar2->th).top = level;
  (pGVar2->h).node = (Node *)&pgVar1->uvhead;
  (pGVar2->h).lastfree = (Node *)(pgVar1->uvhead).u.l.next;
  ((pGVar2->th).ci)->next = (CallInfo *)pGVar2;
  (pgVar1->uvhead).u.l.next = (UpVal *)pGVar2;
  return (UpVal *)pGVar2;
}

Assistant:

UpVal *luaF_findupval (lua_State *L, StkId level) {
  global_State *g = G(L);
  GCObject **pp = &L->openupval;
  UpVal *p;
  UpVal *uv;
  while (*pp != NULL && (p = gco2uv(*pp))->v >= level) {
    GCObject *o = obj2gco(p);
    lua_assert(p->v != &p->u.value);
    lua_assert(!isold(o) || isold(obj2gco(L)));
    if (p->v == level) {  /* found a corresponding upvalue? */
      if (isdead(g, o))  /* is it dead? */
        changewhite(o);  /* resurrect it */
      return p;
    }
    pp = &p->next;
  }
  /* not found: create a new one */
  uv = &luaC_newobj(L, LUA_TUPVAL, sizeof(UpVal), pp, 0)->uv;
  uv->v = level;  /* current value lives in the stack */
  uv->u.l.prev = &g->uvhead;  /* double link it in `uvhead' list */
  uv->u.l.next = g->uvhead.u.l.next;
  uv->u.l.next->u.l.prev = uv;
  g->uvhead.u.l.next = uv;
  lua_assert(uv->u.l.next->u.l.prev == uv && uv->u.l.prev->u.l.next == uv);
  return uv;
}